

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O1

void handlePrintOption(KinDynComputations *comp,parser *cmd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"print","");
  bVar2 = cmdline::parser::exist(cmd,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    iDynTree::KinDynComputations::getRobotModel();
    iDynTree::Model::toString_abi_cxx11_();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void handlePrintOption(iDynTree::KinDynComputations & comp, cmdline::parser & cmd)
{
    if( !cmd.exist("print") )
    {
        return;
    }

    std::cout << comp.getRobotModel().toString() << std::endl;
}